

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<double>_>::AddKel
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *source,TPZVec<long> *destination)

{
  TPZFMatrix<std::complex<double>_> *pTVar1;
  int64_t iVar2;
  long *plVar3;
  complex<double> *this_00;
  TPZVec<long> *in_RCX;
  TPZVec<long> *in_RDX;
  long in_RDI;
  int64_t index;
  int64_t col;
  int64_t row;
  int64_t jeqs;
  int64_t ieqs;
  int64_t jeq;
  int64_t ieq;
  int64_t jcoef;
  int64_t icoef;
  int64_t nelem;
  complex<double> *in_stack_ffffffffffffff78;
  long row_00;
  TPZFMatrix<std::complex<double>_> *this_01;
  long local_38;
  long local_30;
  
  iVar2 = TPZVec<long>::NElements(in_RDX);
  for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
    plVar3 = TPZVec<long>::operator[](in_RCX,local_30);
    pTVar1 = (TPZFMatrix<std::complex<double>_> *)*plVar3;
    TPZVec<long>::operator[](in_RDX,local_30);
    for (local_38 = local_30; local_38 < iVar2; local_38 = local_38 + 1) {
      plVar3 = TPZVec<long>::operator[](in_RCX,local_38);
      row_00 = *plVar3;
      TPZVec<long>::operator[](in_RDX,local_38);
      this_01 = pTVar1;
      if (row_00 < (long)pTVar1) {
        TPZMatrix<std::complex<double>_>::Swap
                  ((int64_t *)&stack0xffffffffffffffa0,(int64_t *)&stack0xffffffffffffff98);
      }
      this_00 = TPZFMatrix<std::complex<double>_>::operator()(this_01,row_00,row_00 - (long)this_01)
      ;
      TPZVec<std::complex<double>_*>::operator[]
                ((TPZVec<std::complex<double>_*> *)(in_RDI + 0x20),row_00);
      std::complex<double>::operator+=(this_00,in_stack_ffffffffffffff78);
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::AddKel(TPZFMatrix<TVar>&elmat,
                                 TPZVec<int64_t> &source,
                                 TPZVec<int64_t> &destination)
{
    int64_t nelem = source.NElements();
    int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    for(icoef=0; icoef<nelem; icoef++) {
        ieq = destination[icoef];
        ieqs = source[icoef];
        for(jcoef=icoef; jcoef<nelem; jcoef++) {
            jeq = destination[jcoef];
            jeqs = source[jcoef];
            int64_t row(ieq), col(jeq);
            // invertendo linha-coluna para triangular superior
            if (row > col)
                this->Swap(&row, &col);
#ifdef PZDEBUG
            // checando limites
            if(row >= this->Dim() || col >= this->Dim()) {
                cout << "TPZSkylMatrix::GetVal index out of range row = " <<
                row << " col = " << col << endl;
                DebugStop();
            }
#endif
            // indice do vetor coluna
            int64_t index = col - row;
#ifdef PZDEBUG
            // checando limite da coluna
            if (index >= Size(col)) {
                cerr << "Try TPZSkylMatrix gZero." << endl;
                DebugStop();
            }
#endif
            // executando contribuição
            fElem[col][index] += elmat(ieqs,jeqs);

        }
    }
}